

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

char * sfts_free(sfts_t *f)

{
  int iVar1;
  int *status;
  undefined8 uVar2;
  void *in_RDI;
  char *_base_1;
  char _msg_1 [31];
  char *name;
  char *h;
  char *_base;
  char _msg [31];
  int *s;
  char *ret;
  int *in_stack_00000140;
  fitsfile *in_stack_00000148;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 local_98;
  char *in_stack_ffffffffffffff70;
  undefined1 local_88 [30];
  undefined1 local_6a;
  char *local_60;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  sfts_t *in_stack_ffffffffffffffc0;
  char *local_18;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_18 = (char *)0x0;
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x10) == 0) {
      ffclos(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      if ((in_RDI != (void *)0x0) && (*(int *)((long)in_RDI + 0x20) != 0)) {
        if (*(long *)((long)in_RDI + 0x10) == 0) {
          local_98 = g_strdup("memory");
        }
        else {
          local_98 = g_path_get_basename(*(undefined8 *)((long)in_RDI + 0x10));
        }
        ffgerr(iVar1,(char *)in_stack_ffffffffffffff58);
        _p2sc_msg("sfts_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0x8f,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
                  &stack0xffffffffffffffb8,local_98);
        exit(1);
      }
      return (char *)0x0;
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      ffpcks(in_stack_00000148,in_stack_00000140);
      status = (int *)p2sc_get_string(in_stack_ffffffffffffff48);
      if (status != (int *)0x0) {
        ffphis((fitsfile *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0,status);
      }
      while (iVar1 = commit_fits(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), iVar1 != 0) {
        iVar1 = compare_fits((sfts_t *)_msg_1._0_8_);
        if (iVar1 == 0) {
          commit_fits(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          break;
        }
        local_60 = new_name(in_stack_ffffffffffffff70);
        g_free(*(undefined8 *)((long)in_RDI + 0x10));
        *(char **)((long)in_RDI + 0x10) = local_60;
      }
    }
    ffclos(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if ((in_RDI != (void *)0x0) && (*(int *)((long)in_RDI + 0x20) != 0)) {
      if (*(long *)((long)in_RDI + 0x10) == 0) {
        uVar2 = g_strdup("memory");
      }
      else {
        uVar2 = g_path_get_basename(*(undefined8 *)((long)in_RDI + 0x10));
      }
      ffgerr((int)((ulong)uVar2 >> 0x20),(char *)in_stack_ffffffffffffff58);
      local_6a = 0;
      _p2sc_msg("sfts_free",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                ,0xab,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
                local_88,uVar2);
      exit(1);
    }
    local_18 = (char *)g_strdup(*(undefined8 *)((long)in_RDI + 0x10));
    g_free(*(undefined8 *)((long)in_RDI + 8));
    g_free(*(undefined8 *)((long)in_RDI + 0x10));
    memset(in_RDI,0,0x28);
    g_free(in_RDI);
  }
  return local_18;
}

Assistant:

char *sfts_free(sfts_t *f) {
    char *ret = NULL;

    if (f) {
        int *s = &f->stat;

        /* temporary file in memory */
        if (!f->name) {
            fits_close_file(f->fts, s);
            CHK_FTS(f);
            return NULL;
        }

        /* commit memory file to disk */
        if (f->ptr) {
            /* write history & chksum */
            fits_write_chksum(f->fts, s);
            const char *h = p2sc_get_string("history");
            if (h)
                fits_write_history(f->fts, h, s);

          restart:
            if (commit_fits(f, 0)) {
                /* identical data, will replace */
                if (!compare_fits(f))
                    commit_fits(f, 1);
                else {
                    char *name = new_name(f->name);

                    g_free(f->name);
                    f->name = name;
                    goto restart;
                }
            }
        }

        fits_close_file(f->fts, s);
        CHK_FTS(f);

        ret = g_strdup(f->name);

        g_free(f->ptr);
        g_free(f->name);
        memset(f, 0, sizeof *f);
        g_free(f);
    }

    return ret;
}